

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cpp
# Opt level: O1

void test_object(void)

{
  bool bVar1;
  char cVar2;
  version vVar3;
  object *poVar4;
  uint *puVar5;
  long *plVar6;
  undefined8 *puVar7;
  wostream *pwVar8;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar9;
  initializer_list<mjs::string> __l;
  vector<mjs::string,_std::allocator<mjs::string>_> _l;
  gc_heap_ptr<mjs::object> o;
  value _r;
  string n;
  string n2;
  gc_heap h;
  undefined1 local_120 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  anon_union_32_5_7b1e0779_for_value_3 aStack_e0;
  gc_heap_ptr_untyped local_b8;
  gc_heap_ptr_untyped local_a8;
  allocator_type local_91;
  gc_heap_ptr_untyped local_90;
  gc_heap local_80;
  
  mjs::gc_heap::gc_heap(&local_80,0x100);
  local_e8 = (undefined1  [8])0x6;
  aStack_e0.n_ = 8.1786194222187e-318;
  mjs::string::string((string *)local_120,&local_80,(string_view *)local_e8);
  local_b8.heap_ = (gc_heap *)0x0;
  mjs::gc_heap::allocate_and_construct<mjs::object,mjs::string,decltype(nullptr)>
            ((gc_heap *)local_f8,(size_t)&local_80,(string *)0x20,(void **)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  poVar4 = (object *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
  mjs::object::enumerable_property_names
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_120,poVar4);
  local_e8 = (undefined1  [8])0x0;
  aStack_e0.n_ = 0.0;
  aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = 0;
  aStack_e0._12_4_ = 0;
  if (local_118._0_8_ == local_120) {
    bVar1 = std::__equal<false>::equal<mjs::string_const*,mjs::string_const*>
                      ((string *)local_120,local_118._0_8_,(string *)0x0);
    if (bVar1) {
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_e8);
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_120);
      local_120 = (undefined1  [8])0x4;
      local_118.n_ = 8.17898503079662e-318;
      mjs::string::string((string *)&local_b8,&local_80,(string_view *)local_120);
      local_120 = (undefined1  [8])0x3;
      local_118.n_ = 8.17900973407892e-318;
      mjs::string::string((string *)&local_a8,&local_80,(string_view *)local_120);
      poVar4 = (object *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
      puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
      local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)(puVar5 + 1);
      local_120 = (undefined1  [8])(ulong)*puVar5;
      bVar1 = mjs::object::has_property(poVar4,(wstring_view *)local_120);
      if (bVar1) {
        pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
        pwVar8 = std::operator<<(pwVar8," in ");
        pwVar8 = std::operator<<(pwVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                );
        pwVar8 = std::operator<<(pwVar8,":");
        pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x36);
        pwVar8 = std::operator<<(pwVar8,":\n");
        pwVar8 = std::operator<<(pwVar8,"!!(!o->has_property(n.view()))");
        pwVar8 = std::operator<<(pwVar8," != ");
        pwVar8 = std::operator<<(pwVar8,"true");
        pwVar8 = std::operator<<(pwVar8,"\n");
        pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
        pwVar8 = std::operator<<(pwVar8," != ");
        pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
        pwVar8 = std::operator<<(pwVar8,"\n");
        vVar3 = tested_version();
        pbVar9 = mjs::operator<<(pwVar8,vVar3);
        std::operator<<(pbVar9,"\n");
      }
      else {
        poVar4 = (object *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
        puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_a8);
        local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar5 + 1);
        local_120 = (undefined1  [8])(ulong)*puVar5;
        bVar1 = mjs::object::has_property(poVar4,(wstring_view *)local_120);
        if (bVar1) {
          pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
          pwVar8 = std::operator<<(pwVar8," in ");
          pwVar8 = std::operator<<(pwVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                  );
          pwVar8 = std::operator<<(pwVar8,":");
          pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x37);
          pwVar8 = std::operator<<(pwVar8,":\n");
          pwVar8 = std::operator<<(pwVar8,"!!(!o->has_property(n2.view()))");
          pwVar8 = std::operator<<(pwVar8," != ");
          pwVar8 = std::operator<<(pwVar8,"true");
          pwVar8 = std::operator<<(pwVar8,"\n");
          pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
          pwVar8 = std::operator<<(pwVar8," != ");
          pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
          pwVar8 = std::operator<<(pwVar8,"\n");
          vVar3 = tested_version();
          pbVar9 = mjs::operator<<(pwVar8,vVar3);
          std::operator<<(pbVar9,"\n");
        }
        else {
          poVar4 = (object *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
          puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
          local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar5 + 1);
          local_120 = (undefined1  [8])(ulong)*puVar5;
          bVar1 = mjs::object::can_put(poVar4,(wstring_view *)local_120);
          if (bVar1) {
            plVar6 = (long *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
            local_120._0_4_ = 3;
            local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                 (gc_heap *)0x4045000000000000;
            (**(code **)(*plVar6 + 8))(plVar6,&local_b8,local_120,0);
            mjs::value::destroy((value *)local_120);
            poVar4 = (object *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
            puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
            local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                 (gc_heap *)(puVar5 + 1);
            local_120 = (undefined1  [8])(ulong)*puVar5;
            bVar1 = mjs::object::has_property(poVar4,(wstring_view *)local_120);
            if (bVar1) {
              poVar4 = (object *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
              puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
              local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                   (gc_heap *)(puVar5 + 1);
              local_120 = (undefined1  [8])(ulong)*puVar5;
              bVar1 = mjs::object::can_put(poVar4,(wstring_view *)local_120);
              if (bVar1) {
                plVar6 = (long *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
                local_120._0_4_ = 4;
                local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                     local_a8.heap_;
                local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
                     local_a8.pos_;
                if (local_a8.heap_ != (gc_heap *)0x0) {
                  mjs::gc_heap::attach(local_a8.heap_,(gc_heap_ptr_untyped *)&local_118.s_);
                }
                (**(code **)(*plVar6 + 8))(plVar6,&local_a8,local_120,7);
                mjs::value::destroy((value *)local_120);
                poVar4 = (object *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
                puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_a8);
                local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                     (gc_heap *)(puVar5 + 1);
                local_120 = (undefined1  [8])(ulong)*puVar5;
                bVar1 = mjs::object::has_property(poVar4,(wstring_view *)local_120);
                if (bVar1) {
                  poVar4 = (object *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
                  puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_a8);
                  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                       (gc_heap *)(puVar5 + 1);
                  local_120 = (undefined1  [8])(ulong)*puVar5;
                  bVar1 = mjs::object::can_put(poVar4,(wstring_view *)local_120);
                  if (bVar1) {
                    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                    pwVar8 = std::operator<<(pwVar8," in ");
                    pwVar8 = std::operator<<(pwVar8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                            );
                    pwVar8 = std::operator<<(pwVar8,":");
                    pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x3e);
                    pwVar8 = std::operator<<(pwVar8,":\n");
                    pwVar8 = std::operator<<(pwVar8,"!!(!o->can_put(n2.view()))");
                    pwVar8 = std::operator<<(pwVar8," != ");
                    pwVar8 = std::operator<<(pwVar8,"true");
                    pwVar8 = std::operator<<(pwVar8,"\n");
                    pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                    pwVar8 = std::operator<<(pwVar8," != ");
                    pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                    pwVar8 = std::operator<<(pwVar8,"\n");
                    vVar3 = tested_version();
                    pbVar9 = mjs::operator<<(pwVar8,vVar3);
                    std::operator<<(pbVar9,"\n");
                  }
                  else {
                    puVar7 = (undefined8 *)
                             mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
                    puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
                    aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                         (gc_heap *)(puVar5 + 1);
                    local_e8 = (undefined1  [8])(ulong)*puVar5;
                    (**(code **)*puVar7)(local_120,puVar7);
                    local_e8._0_4_ = 3;
                    aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                         (gc_heap *)0x4045000000000000;
                    bVar1 = mjs::operator==((value *)local_120,(value *)local_e8);
                    if (bVar1) {
                      mjs::value::destroy((value *)local_e8);
                      mjs::value::destroy((value *)local_120);
                      puVar7 = (undefined8 *)
                               mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
                      puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_a8);
                      aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_
                           = (gc_heap *)(puVar5 + 1);
                      local_e8 = (undefined1  [8])(ulong)*puVar5;
                      (**(code **)*puVar7)(local_120,puVar7);
                      local_e8._0_4_ = 4;
                      aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_
                           = local_a8.heap_;
                      aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                           = local_a8.pos_;
                      if (local_a8.heap_ != (gc_heap *)0x0) {
                        mjs::gc_heap::attach(local_a8.heap_,(gc_heap_ptr_untyped *)&aStack_e0.s_);
                      }
                      bVar1 = mjs::operator==((value *)local_120,(value *)local_e8);
                      if (bVar1) {
                        mjs::value::destroy((value *)local_e8);
                        mjs::value::destroy((value *)local_120);
                        poVar4 = (object *)
                                 mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
                        mjs::object::enumerable_property_names
                                  ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_120,
                                   poVar4);
                        local_90.heap_ = local_b8.heap_;
                        local_90.pos_ = local_b8.pos_;
                        if (local_b8.heap_ != (gc_heap *)0x0) {
                          mjs::gc_heap::attach(local_b8.heap_,&local_90);
                        }
                        __l._M_len = 1;
                        __l._M_array = (iterator)&local_90;
                        std::vector<mjs::string,_std::allocator<mjs::string>_>::vector
                                  ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_e8,__l
                                   ,&local_91);
                        mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
                        if ((long)local_118.s_.super_gc_heap_ptr<mjs::gc_string>.
                                  super_gc_heap_ptr_untyped.heap_ - (long)local_120 ==
                            (long)aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.
                                  super_gc_heap_ptr_untyped.heap_ - (long)local_e8) {
                          bVar1 = std::__equal<false>::equal<mjs::string_const*,mjs::string_const*>
                                            ((string *)local_120,local_118._0_8_,(string *)local_e8)
                          ;
                          if (bVar1) {
                            std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                                      ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_e8
                                      );
                            std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                                      ((vector<mjs::string,_std::allocator<mjs::string>_> *)
                                       local_120);
                            plVar6 = (long *)mjs::gc_heap_ptr_untyped::get
                                                       ((gc_heap_ptr_untyped *)local_f8);
                            local_120._0_4_ = 4;
                            local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                            .heap_ = local_b8.heap_;
                            local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                            .pos_ = local_b8.pos_;
                            if (local_b8.heap_ != (gc_heap *)0x0) {
                              mjs::gc_heap::attach
                                        (local_b8.heap_,(gc_heap_ptr_untyped *)&local_118.s_);
                            }
                            (**(code **)(*plVar6 + 8))(plVar6,&local_b8,local_120,0);
                            mjs::value::destroy((value *)local_120);
                            puVar7 = (undefined8 *)
                                     mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f8);
                            puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
                            aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                            .heap_ = (gc_heap *)(puVar5 + 1);
                            local_e8 = (undefined1  [8])(ulong)*puVar5;
                            (**(code **)*puVar7)(local_120,puVar7);
                            local_e8._0_4_ = 4;
                            aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                            .heap_ = local_b8.heap_;
                            aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                            .pos_ = local_b8.pos_;
                            if (local_b8.heap_ != (gc_heap *)0x0) {
                              mjs::gc_heap::attach
                                        (local_b8.heap_,(gc_heap_ptr_untyped *)&aStack_e0.s_);
                            }
                            bVar1 = mjs::operator==((value *)local_120,(value *)local_e8);
                            if (bVar1) {
                              mjs::value::destroy((value *)local_e8);
                              mjs::value::destroy((value *)local_120);
                              plVar6 = (long *)mjs::gc_heap_ptr_untyped::get
                                                         ((gc_heap_ptr_untyped *)local_f8);
                              puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
                              local_118.s_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.heap_ = (gc_heap *)(puVar5 + 1);
                              local_120 = (undefined1  [8])(ulong)*puVar5;
                              cVar2 = (**(code **)(*plVar6 + 0x10))(plVar6);
                              if (cVar2 == '\0') {
                                pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                                pwVar8 = std::operator<<(pwVar8," in ");
                                pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                pwVar8 = std::operator<<(pwVar8,":");
                                pwVar8 = (wostream *)
                                         std::wostream::operator<<((wostream *)pwVar8,0x44);
                                pwVar8 = std::operator<<(pwVar8,":\n");
                                pwVar8 = std::operator<<(pwVar8,"!!(o->delete_property(n.view()))");
                                pwVar8 = std::operator<<(pwVar8," != ");
                                pwVar8 = std::operator<<(pwVar8,"true");
                                pwVar8 = std::operator<<(pwVar8,"\n");
                                pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                pwVar8 = std::operator<<(pwVar8," != ");
                                pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                pwVar8 = std::operator<<(pwVar8,"\n");
                                vVar3 = tested_version();
                                pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                std::operator<<(pbVar9,"\n");
                              }
                              else {
                                poVar4 = (object *)
                                         mjs::gc_heap_ptr_untyped::get
                                                   ((gc_heap_ptr_untyped *)local_f8);
                                puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
                                local_118.s_.super_gc_heap_ptr<mjs::gc_string>.
                                super_gc_heap_ptr_untyped.heap_ = (gc_heap *)(puVar5 + 1);
                                local_120 = (undefined1  [8])(ulong)*puVar5;
                                bVar1 = mjs::object::has_property(poVar4,(wstring_view *)local_120);
                                if (bVar1) {
                                  pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                                  pwVar8 = std::operator<<(pwVar8," in ");
                                  pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                  pwVar8 = std::operator<<(pwVar8,":");
                                  pwVar8 = (wostream *)
                                           std::wostream::operator<<((wostream *)pwVar8,0x45);
                                  pwVar8 = std::operator<<(pwVar8,":\n");
                                  pwVar8 = std::operator<<(pwVar8,"!!(!o->has_property(n.view()))");
                                  pwVar8 = std::operator<<(pwVar8," != ");
                                  pwVar8 = std::operator<<(pwVar8,"true");
                                  pwVar8 = std::operator<<(pwVar8,"\n");
                                  pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                  pwVar8 = std::operator<<(pwVar8," != ");
                                  pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                  pwVar8 = std::operator<<(pwVar8,"\n");
                                  vVar3 = tested_version();
                                  pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                  std::operator<<(pbVar9,"\n");
                                }
                                else {
                                  poVar4 = (object *)
                                           mjs::gc_heap_ptr_untyped::get
                                                     ((gc_heap_ptr_untyped *)local_f8);
                                  puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_b8);
                                  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.
                                  super_gc_heap_ptr_untyped.heap_ = (gc_heap *)(puVar5 + 1);
                                  local_120 = (undefined1  [8])(ulong)*puVar5;
                                  bVar1 = mjs::object::can_put(poVar4,(wstring_view *)local_120);
                                  if (bVar1) {
                                    poVar4 = (object *)
                                             mjs::gc_heap_ptr_untyped::get
                                                       ((gc_heap_ptr_untyped *)local_f8);
                                    puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_a8);
                                    local_118.s_.super_gc_heap_ptr<mjs::gc_string>.
                                    super_gc_heap_ptr_untyped.heap_ = (gc_heap *)(puVar5 + 1);
                                    local_120 = (undefined1  [8])(ulong)*puVar5;
                                    bVar1 = mjs::object::has_property
                                                      (poVar4,(wstring_view *)local_120);
                                    if (bVar1) {
                                      poVar4 = (object *)
                                               mjs::gc_heap_ptr_untyped::get
                                                         ((gc_heap_ptr_untyped *)local_f8);
                                      puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_a8);
                                      local_118.s_.super_gc_heap_ptr<mjs::gc_string>.
                                      super_gc_heap_ptr_untyped.heap_ = (gc_heap *)(puVar5 + 1);
                                      local_120 = (undefined1  [8])(ulong)*puVar5;
                                      bVar1 = mjs::object::can_put(poVar4,(wstring_view *)local_120)
                                      ;
                                      if (bVar1) {
                                        pwVar8 = std::operator<<((wostream *)&std::wcerr,
                                                                 "test_object");
                                        pwVar8 = std::operator<<(pwVar8," in ");
                                        pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                        pwVar8 = std::operator<<(pwVar8,":");
                                        pwVar8 = (wostream *)
                                                 std::wostream::operator<<((wostream *)pwVar8,0x48);
                                        pwVar8 = std::operator<<(pwVar8,":\n");
                                        pwVar8 = std::operator<<(pwVar8,"!!(!o->can_put(n2.view()))"
                                                                );
                                        pwVar8 = std::operator<<(pwVar8," != ");
                                        pwVar8 = std::operator<<(pwVar8,"true");
                                        pwVar8 = std::operator<<(pwVar8,"\n");
                                        pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                        pwVar8 = std::operator<<(pwVar8," != ");
                                        pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                        pwVar8 = std::operator<<(pwVar8,"\n");
                                        vVar3 = tested_version();
                                        pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                        std::operator<<(pbVar9,"\n");
                                      }
                                      else {
                                        plVar6 = (long *)mjs::gc_heap_ptr_untyped::get
                                                                   ((gc_heap_ptr_untyped *)local_f8)
                                        ;
                                        puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_a8);
                                        local_118.s_.super_gc_heap_ptr<mjs::gc_string>.
                                        super_gc_heap_ptr_untyped.heap_ = (gc_heap *)(puVar5 + 1);
                                        local_120 = (undefined1  [8])(ulong)*puVar5;
                                        cVar2 = (**(code **)(*plVar6 + 0x10))(plVar6);
                                        if (cVar2 == '\x01') {
                                          pwVar8 = std::operator<<((wostream *)&std::wcerr,
                                                                   "test_object");
                                          pwVar8 = std::operator<<(pwVar8," in ");
                                          pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                          pwVar8 = std::operator<<(pwVar8,":");
                                          pwVar8 = (wostream *)
                                                   std::wostream::operator<<
                                                             ((wostream *)pwVar8,0x49);
                                          pwVar8 = std::operator<<(pwVar8,":\n");
                                          pwVar8 = std::operator<<(pwVar8,
                                                  "!!(!o->delete_property(n2.view()))");
                                          pwVar8 = std::operator<<(pwVar8," != ");
                                          pwVar8 = std::operator<<(pwVar8,"true");
                                          pwVar8 = std::operator<<(pwVar8,"\n");
                                          pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                          pwVar8 = std::operator<<(pwVar8," != ");
                                          pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                          pwVar8 = std::operator<<(pwVar8,"\n");
                                          vVar3 = tested_version();
                                          pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                          std::operator<<(pbVar9,"\n");
                                        }
                                        else {
                                          poVar4 = (object *)
                                                   mjs::gc_heap_ptr_untyped::get
                                                             ((gc_heap_ptr_untyped *)local_f8);
                                          puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get(&local_a8);
                                          local_118.s_.super_gc_heap_ptr<mjs::gc_string>.
                                          super_gc_heap_ptr_untyped.heap_ = (gc_heap *)(puVar5 + 1);
                                          local_120 = (undefined1  [8])(ulong)*puVar5;
                                          bVar1 = mjs::object::has_property
                                                            (poVar4,(wstring_view *)local_120);
                                          if (bVar1) {
                                            puVar7 = (undefined8 *)
                                                     mjs::gc_heap_ptr_untyped::get
                                                               ((gc_heap_ptr_untyped *)local_f8);
                                            puVar5 = (uint *)mjs::gc_heap_ptr_untyped::get
                                                                       (&local_a8);
                                            aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.
                                            super_gc_heap_ptr_untyped.heap_ =
                                                 (gc_heap *)(puVar5 + 1);
                                            local_e8 = (undefined1  [8])(ulong)*puVar5;
                                            (**(code **)*puVar7)(local_120,puVar7);
                                            local_e8._0_4_ = 4;
                                            aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.
                                            super_gc_heap_ptr_untyped.heap_ = local_a8.heap_;
                                            aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.
                                            super_gc_heap_ptr_untyped.pos_ = local_a8.pos_;
                                            if (local_a8.heap_ != (gc_heap *)0x0) {
                                              mjs::gc_heap::attach
                                                        (local_a8.heap_,
                                                         (gc_heap_ptr_untyped *)&aStack_e0.s_);
                                            }
                                            bVar1 = mjs::operator==((value *)local_120,
                                                                    (value *)local_e8);
                                            if (bVar1) {
                                              mjs::value::destroy((value *)local_e8);
                                              mjs::value::destroy((value *)local_120);
                                              poVar4 = (object *)
                                                       mjs::gc_heap_ptr_untyped::get
                                                                 ((gc_heap_ptr_untyped *)local_f8);
                                              mjs::object::enumerable_property_names
                                                        ((
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)local_120,poVar4);
                                              local_e8 = (undefined1  [8])0x0;
                                              aStack_e0.n_ = 0.0;
                                              aStack_e0.s_.super_gc_heap_ptr<mjs::gc_string>.
                                              super_gc_heap_ptr_untyped.pos_ = 0;
                                              aStack_e0._12_4_ = 0;
                                              if (local_118._0_8_ == local_120) {
                                                bVar1 = std::__equal<false>::
                                                        equal<mjs::string_const*,mjs::string_const*>
                                                                  ((string *)local_120,
                                                                   local_118._0_8_,(string *)0x0);
                                                if (bVar1) {
                                                  std::
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  ::~vector((
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)local_e8);
                                                  std::
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  ::~vector((
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)local_120);
                                                  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                            (&local_a8);
                                                  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                            (&local_b8);
                                                  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                            ((gc_heap_ptr_untyped *)local_f8);
                                                  mjs::gc_heap::garbage_collect(&local_80);
                                                  if ((int)(((ulong)(local_80.alloc_context_.
                                                                     next_free_ -
                                                                    local_80.alloc_context_.start_)
                                                            * 100) / (ulong)(local_80.alloc_context_
                                                                             .capacity_ -
                                                                            local_80.alloc_context_.
                                                                            start_)) == 0) {
                                                    mjs::gc_heap::~gc_heap(&local_80);
                                                    return;
                                                  }
                                                  __assert_fail("h.use_percentage() == 0",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  ,0x50,"void test_object()");
                                                }
                                              }
                                              pwVar8 = std::operator<<((wostream *)&std::wcerr,
                                                                       "test_object");
                                              pwVar8 = std::operator<<(pwVar8," in ");
                                              pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                              pwVar8 = std::operator<<(pwVar8,":");
                                              pwVar8 = (wostream *)
                                                       std::wostream::operator<<
                                                                 ((wostream *)pwVar8,0x4c);
                                              pwVar8 = std::operator<<(pwVar8,":\n");
                                              pwVar8 = std::operator<<(pwVar8,
                                                  "o->enumerable_property_names()");
                                              pwVar8 = std::operator<<(pwVar8," != ");
                                              pwVar8 = std::operator<<(pwVar8,
                                                  "(std::vector<string>{})");
                                              pwVar8 = std::operator<<(pwVar8,"\n");
                                              pbVar9 = operator<<(pwVar8,(
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)local_120);
                                              pwVar8 = std::operator<<(pbVar9," != ");
                                              pbVar9 = operator<<(pwVar8,(
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)local_e8);
                                              pwVar8 = std::operator<<(pbVar9,"\n");
                                              vVar3 = tested_version();
                                              pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                              std::operator<<(pbVar9,"\n");
                                            }
                                            else {
                                              pwVar8 = std::operator<<((wostream *)&std::wcerr,
                                                                       "test_object");
                                              pwVar8 = std::operator<<(pwVar8," in ");
                                              pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                              pwVar8 = std::operator<<(pwVar8,":");
                                              pwVar8 = (wostream *)
                                                       std::wostream::operator<<
                                                                 ((wostream *)pwVar8,0x4b);
                                              pwVar8 = std::operator<<(pwVar8,":\n");
                                              pwVar8 = std::operator<<(pwVar8,"o->get(n2.view())");
                                              pwVar8 = std::operator<<(pwVar8," != ");
                                              pwVar8 = std::operator<<(pwVar8,"value{n2}");
                                              pwVar8 = std::operator<<(pwVar8,"\n");
                                              mjs::debug_print(pwVar8,(value *)local_120,4,
                                                               0x7fffffff,0);
                                              pwVar8 = std::operator<<(pwVar8," != ");
                                              mjs::debug_print(pwVar8,(value *)local_e8,4,0x7fffffff
                                                               ,0);
                                              pwVar8 = std::operator<<(pwVar8,"\n");
                                              vVar3 = tested_version();
                                              pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                              std::operator<<(pbVar9,"\n");
                                            }
                                          }
                                          else {
                                            pwVar8 = std::operator<<((wostream *)&std::wcerr,
                                                                     "test_object");
                                            pwVar8 = std::operator<<(pwVar8," in ");
                                            pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                            pwVar8 = std::operator<<(pwVar8,":");
                                            pwVar8 = (wostream *)
                                                     std::wostream::operator<<
                                                               ((wostream *)pwVar8,0x4a);
                                            pwVar8 = std::operator<<(pwVar8,":\n");
                                            pwVar8 = std::operator<<(pwVar8,
                                                  "!!(o->has_property(n2.view()))");
                                            pwVar8 = std::operator<<(pwVar8," != ");
                                            pwVar8 = std::operator<<(pwVar8,"true");
                                            pwVar8 = std::operator<<(pwVar8,"\n");
                                            pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0))
                                            ;
                                            pwVar8 = std::operator<<(pwVar8," != ");
                                            pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0))
                                            ;
                                            pwVar8 = std::operator<<(pwVar8,"\n");
                                            vVar3 = tested_version();
                                            pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                            std::operator<<(pbVar9,"\n");
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object"
                                                              );
                                      pwVar8 = std::operator<<(pwVar8," in ");
                                      pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                      pwVar8 = std::operator<<(pwVar8,":");
                                      pwVar8 = (wostream *)
                                               std::wostream::operator<<((wostream *)pwVar8,0x47);
                                      pwVar8 = std::operator<<(pwVar8,":\n");
                                      pwVar8 = std::operator<<(pwVar8,
                                                  "!!(o->has_property(n2.view()))");
                                      pwVar8 = std::operator<<(pwVar8," != ");
                                      pwVar8 = std::operator<<(pwVar8,"true");
                                      pwVar8 = std::operator<<(pwVar8,"\n");
                                      pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                      pwVar8 = std::operator<<(pwVar8," != ");
                                      pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                      pwVar8 = std::operator<<(pwVar8,"\n");
                                      vVar3 = tested_version();
                                      pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                      std::operator<<(pbVar9,"\n");
                                    }
                                  }
                                  else {
                                    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                                    pwVar8 = std::operator<<(pwVar8," in ");
                                    pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                    pwVar8 = std::operator<<(pwVar8,":");
                                    pwVar8 = (wostream *)
                                             std::wostream::operator<<((wostream *)pwVar8,0x46);
                                    pwVar8 = std::operator<<(pwVar8,":\n");
                                    pwVar8 = std::operator<<(pwVar8,"!!(o->can_put(n.view()))");
                                    pwVar8 = std::operator<<(pwVar8," != ");
                                    pwVar8 = std::operator<<(pwVar8,"true");
                                    pwVar8 = std::operator<<(pwVar8,"\n");
                                    pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                    pwVar8 = std::operator<<(pwVar8," != ");
                                    pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                                    pwVar8 = std::operator<<(pwVar8,"\n");
                                    vVar3 = tested_version();
                                    pbVar9 = mjs::operator<<(pwVar8,vVar3);
                                    std::operator<<(pbVar9,"\n");
                                  }
                                }
                              }
                            }
                            else {
                              pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                              pwVar8 = std::operator<<(pwVar8," in ");
                              pwVar8 = std::operator<<(pwVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                              pwVar8 = std::operator<<(pwVar8,":");
                              pwVar8 = (wostream *)
                                       std::wostream::operator<<((wostream *)pwVar8,0x43);
                              pwVar8 = std::operator<<(pwVar8,":\n");
                              pwVar8 = std::operator<<(pwVar8,"o->get(n.view())");
                              pwVar8 = std::operator<<(pwVar8," != ");
                              pwVar8 = std::operator<<(pwVar8,"value{n}");
                              pwVar8 = std::operator<<(pwVar8,"\n");
                              mjs::debug_print(pwVar8,(value *)local_120,4,0x7fffffff,0);
                              pwVar8 = std::operator<<(pwVar8," != ");
                              mjs::debug_print(pwVar8,(value *)local_e8,4,0x7fffffff,0);
                              pwVar8 = std::operator<<(pwVar8,"\n");
                              vVar3 = tested_version();
                              pbVar9 = mjs::operator<<(pwVar8,vVar3);
                              std::operator<<(pbVar9,"\n");
                            }
                            goto LAB_00114fc3;
                          }
                        }
                        pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                        pwVar8 = std::operator<<(pwVar8," in ");
                        pwVar8 = std::operator<<(pwVar8,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                );
                        pwVar8 = std::operator<<(pwVar8,":");
                        pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x41);
                        pwVar8 = std::operator<<(pwVar8,":\n");
                        pwVar8 = std::operator<<(pwVar8,"o->enumerable_property_names()");
                        pwVar8 = std::operator<<(pwVar8," != ");
                        pwVar8 = std::operator<<(pwVar8,"(std::vector<string>{n})");
                        pwVar8 = std::operator<<(pwVar8,"\n");
                        pbVar9 = operator<<(pwVar8,(
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)local_120);
                        pwVar8 = std::operator<<(pbVar9," != ");
                        pbVar9 = operator<<(pwVar8,(
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)local_e8);
                        pwVar8 = std::operator<<(pbVar9,"\n");
                        vVar3 = tested_version();
                        pbVar9 = mjs::operator<<(pwVar8,vVar3);
                        std::operator<<(pbVar9,"\n");
                      }
                      else {
                        pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                        pwVar8 = std::operator<<(pwVar8," in ");
                        pwVar8 = std::operator<<(pwVar8,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                );
                        pwVar8 = std::operator<<(pwVar8,":");
                        pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x40);
                        pwVar8 = std::operator<<(pwVar8,":\n");
                        pwVar8 = std::operator<<(pwVar8,"o->get(n2.view())");
                        pwVar8 = std::operator<<(pwVar8," != ");
                        pwVar8 = std::operator<<(pwVar8,"value{n2}");
                        pwVar8 = std::operator<<(pwVar8,"\n");
                        mjs::debug_print(pwVar8,(value *)local_120,4,0x7fffffff,0);
                        pwVar8 = std::operator<<(pwVar8," != ");
                        mjs::debug_print(pwVar8,(value *)local_e8,4,0x7fffffff,0);
                        pwVar8 = std::operator<<(pwVar8,"\n");
                        vVar3 = tested_version();
                        pbVar9 = mjs::operator<<(pwVar8,vVar3);
                        std::operator<<(pbVar9,"\n");
                      }
                    }
                    else {
                      pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                      pwVar8 = std::operator<<(pwVar8," in ");
                      pwVar8 = std::operator<<(pwVar8,
                                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                              );
                      pwVar8 = std::operator<<(pwVar8,":");
                      pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x3f);
                      pwVar8 = std::operator<<(pwVar8,":\n");
                      pwVar8 = std::operator<<(pwVar8,"o->get(n.view())");
                      pwVar8 = std::operator<<(pwVar8," != ");
                      pwVar8 = std::operator<<(pwVar8,"value{42.0}");
                      pwVar8 = std::operator<<(pwVar8,"\n");
                      mjs::debug_print(pwVar8,(value *)local_120,4,0x7fffffff,0);
                      pwVar8 = std::operator<<(pwVar8," != ");
                      mjs::debug_print(pwVar8,(value *)local_e8,4,0x7fffffff,0);
                      pwVar8 = std::operator<<(pwVar8,"\n");
                      vVar3 = tested_version();
                      pbVar9 = mjs::operator<<(pwVar8,vVar3);
                      std::operator<<(pbVar9,"\n");
                    }
                  }
                }
                else {
                  pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                  pwVar8 = std::operator<<(pwVar8," in ");
                  pwVar8 = std::operator<<(pwVar8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                          );
                  pwVar8 = std::operator<<(pwVar8,":");
                  pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x3d);
                  pwVar8 = std::operator<<(pwVar8,":\n");
                  pwVar8 = std::operator<<(pwVar8,"!!(o->has_property(n2.view()))");
                  pwVar8 = std::operator<<(pwVar8," != ");
                  pwVar8 = std::operator<<(pwVar8,"true");
                  pwVar8 = std::operator<<(pwVar8,"\n");
                  pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                  pwVar8 = std::operator<<(pwVar8," != ");
                  pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                  pwVar8 = std::operator<<(pwVar8,"\n");
                  vVar3 = tested_version();
                  pbVar9 = mjs::operator<<(pwVar8,vVar3);
                  std::operator<<(pbVar9,"\n");
                }
              }
              else {
                pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
                pwVar8 = std::operator<<(pwVar8," in ");
                pwVar8 = std::operator<<(pwVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                        );
                pwVar8 = std::operator<<(pwVar8,":");
                pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x3b);
                pwVar8 = std::operator<<(pwVar8,":\n");
                pwVar8 = std::operator<<(pwVar8,"!!(o->can_put(n.view()))");
                pwVar8 = std::operator<<(pwVar8," != ");
                pwVar8 = std::operator<<(pwVar8,"true");
                pwVar8 = std::operator<<(pwVar8,"\n");
                pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                pwVar8 = std::operator<<(pwVar8," != ");
                pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
                pwVar8 = std::operator<<(pwVar8,"\n");
                vVar3 = tested_version();
                pbVar9 = mjs::operator<<(pwVar8,vVar3);
                std::operator<<(pbVar9,"\n");
              }
            }
            else {
              pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
              pwVar8 = std::operator<<(pwVar8," in ");
              pwVar8 = std::operator<<(pwVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                      );
              pwVar8 = std::operator<<(pwVar8,":");
              pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x3a);
              pwVar8 = std::operator<<(pwVar8,":\n");
              pwVar8 = std::operator<<(pwVar8,"!!(o->has_property(n.view()))");
              pwVar8 = std::operator<<(pwVar8," != ");
              pwVar8 = std::operator<<(pwVar8,"true");
              pwVar8 = std::operator<<(pwVar8,"\n");
              pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
              pwVar8 = std::operator<<(pwVar8," != ");
              pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
              pwVar8 = std::operator<<(pwVar8,"\n");
              vVar3 = tested_version();
              pbVar9 = mjs::operator<<(pwVar8,vVar3);
              std::operator<<(pbVar9,"\n");
            }
          }
          else {
            pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
            pwVar8 = std::operator<<(pwVar8," in ");
            pwVar8 = std::operator<<(pwVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                    );
            pwVar8 = std::operator<<(pwVar8,":");
            pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x38);
            pwVar8 = std::operator<<(pwVar8,":\n");
            pwVar8 = std::operator<<(pwVar8,"!!(o->can_put(n.view()))");
            pwVar8 = std::operator<<(pwVar8," != ");
            pwVar8 = std::operator<<(pwVar8,"true");
            pwVar8 = std::operator<<(pwVar8,"\n");
            pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
            pwVar8 = std::operator<<(pwVar8," != ");
            pwVar8 = std::wostream::_M_insert<bool>(SUB81(pwVar8,0));
            pwVar8 = std::operator<<(pwVar8,"\n");
            vVar3 = tested_version();
            pbVar9 = mjs::operator<<(pwVar8,vVar3);
            std::operator<<(pbVar9,"\n");
          }
        }
      }
      goto LAB_00114fc3;
    }
  }
  pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_object");
  pwVar8 = std::operator<<(pwVar8," in ");
  pwVar8 = std::operator<<(pwVar8,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                          );
  pwVar8 = std::operator<<(pwVar8,":");
  pwVar8 = (wostream *)std::wostream::operator<<((wostream *)pwVar8,0x33);
  pwVar8 = std::operator<<(pwVar8,":\n");
  pwVar8 = std::operator<<(pwVar8,"o->enumerable_property_names()");
  pwVar8 = std::operator<<(pwVar8," != ");
  pwVar8 = std::operator<<(pwVar8,"(std::vector<string>{})");
  pwVar8 = std::operator<<(pwVar8,"\n");
  pbVar9 = operator<<(pwVar8,(vector<mjs::string,_std::allocator<mjs::string>_> *)local_120);
  pwVar8 = std::operator<<(pbVar9," != ");
  pbVar9 = operator<<(pwVar8,(vector<mjs::string,_std::allocator<mjs::string>_> *)local_e8);
  pwVar8 = std::operator<<(pbVar9,"\n");
  vVar3 = tested_version();
  pbVar9 = mjs::operator<<(pwVar8,vVar3);
  std::operator<<(pbVar9,"\n");
LAB_00114fc3:
  abort();
}

Assistant:

void test_object() {
    gc_heap h{1<<8};
    {
        auto o = h.make<object>(string{h, "Object"}, nullptr);
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{}));
        const auto n = string{h,"test"};
        const auto n2 = string{h,"foo"};
        REQUIRE(!o->has_property(n.view()));
        REQUIRE(!o->has_property(n2.view()));
        REQUIRE(o->can_put(n.view()));
        o->put(n, value{42.0});
        REQUIRE(o->has_property(n.view()));
        REQUIRE(o->can_put(n.view()));
        o->put(n2, value{n2}, property_attribute::dont_enum | property_attribute::dont_delete | property_attribute::read_only);
        REQUIRE(o->has_property(n2.view()));
        REQUIRE(!o->can_put(n2.view()));
        REQUIRE_EQ(o->get(n.view()), value{42.0});
        REQUIRE_EQ(o->get(n2.view()), value{n2});
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{n}));
        o->put(n, value{n});
        REQUIRE_EQ(o->get(n.view()), value{n});
        REQUIRE(o->delete_property(n.view()));
        REQUIRE(!o->has_property(n.view()));
        REQUIRE(o->can_put(n.view()));
        REQUIRE(o->has_property(n2.view()));
        REQUIRE(!o->can_put(n2.view()));
        REQUIRE(!o->delete_property(n2.view()));
        REQUIRE(o->has_property(n2.view()));
        REQUIRE_EQ(o->get(n2.view()), value{n2});
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{}));
    }

    h.garbage_collect();
    assert(h.use_percentage() == 0);
}